

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_negation_int_min_Test::TestBody(correctness_negation_int_min_Test *this)

{
  char *message;
  int local_134;
  AssertionResult gtest_ar;
  big_integer local_120;
  big_integer local_e8;
  big_integer local_b0;
  big_integer b;
  big_integer a;
  
  big_integer::big_integer(&a,-0x80000000);
  big_integer::operator-(&b,&a);
  local_134 = 0x7fffffff;
  big_integer::big_integer(&local_b0,&b);
  big_integer::big_integer(&local_120,1);
  operator-(&local_e8,&local_b0,&local_120);
  testing::internal::CmpHelperEQ<int,big_integer>
            ((internal *)&gtest_ar,"std::numeric_limits<int>::max()","b - 1",&local_134,&local_e8);
  big_integer::~big_integer(&local_e8);
  big_integer::~big_integer(&local_120);
  big_integer::~big_integer(&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x12d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  big_integer::~big_integer(&b);
  big_integer::~big_integer(&a);
  return;
}

Assistant:

TEST(correctness, negation_int_min)
{
    big_integer a = std::numeric_limits<int>::min();
    big_integer b = -a;

    EXPECT_EQ(std::numeric_limits<int>::max(), b - 1);
}